

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O0

char * vformat(char *fmt,__va_list_tag *vp)

{
  size_t sVar1;
  size_t len;
  va_list args;
  __va_list_tag *vp_local;
  char *fmt_local;
  
  args[0].reg_save_area = vp;
  if (format_buf == (char *)0x0) {
    format_len = 0x400;
    format_buf = (char *)mem_zalloc(0x400);
    *format_buf = '\0';
  }
  if (fmt != (char *)0x0) {
    while( true ) {
      args[0].overflow_arg_area = *(void **)((long)args[0].reg_save_area + 0x10);
      len = *args[0].reg_save_area;
      args[0]._0_8_ = *(undefined8 *)((long)args[0].reg_save_area + 8);
      sVar1 = vstrnfmt(format_buf,format_len,fmt,(__va_list_tag *)&len);
      if (sVar1 < format_len - 1) break;
      format_len = format_len << 1;
      format_buf = (char *)mem_realloc(format_buf,format_len);
    }
  }
  return format_buf;
}

Assistant:

char *vformat(const char *fmt, va_list vp)
{
	/* Initial allocation */
	if (!format_buf) {
		format_len = 1024;
		format_buf = mem_zalloc(format_len);
		format_buf[0] = 0;
	}

	/* Null format yields last result */
	if (!fmt) return (format_buf);

	/* Keep going until successful */
	while (1) {
		va_list	args;
		size_t len;

		/* Build the string */
		va_copy(args, vp);
		len = vstrnfmt(format_buf, format_len, fmt, args);
		va_end(args);

		/* Success */
		if (len < format_len-1) break;

		/* Grow the buffer */
		format_len = format_len * 2;
		format_buf = mem_realloc(format_buf, format_len);
	}

	/* Return the new buffer */
	return (format_buf);
}